

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeduh.c
# Opt level: O3

int duh_add_signal(DUH *duh,DUH_SIGTYPE_DESC *desc,sigdata_t *sigdata)

{
  DUH_SIGNAL **__src;
  DUH_SIGNAL *pDVar1;
  int iVar2;
  
  iVar2 = -1;
  if (sigdata != (sigdata_t *)0x0 && (desc != (DUH_SIGTYPE_DESC *)0x0 && duh != (DUH *)0x0)) {
    __src = (DUH_SIGNAL **)realloc(duh->signal,(long)duh->n_signals * 8 + 8);
    if (__src != (DUH_SIGNAL **)0x0) {
      duh->signal = __src;
      iVar2 = duh->n_signals;
      memmove(__src + 1,__src,(long)iVar2 << 3);
      duh->n_signals = iVar2 + 1;
      pDVar1 = (DUH_SIGNAL *)malloc(0x10);
      if (pDVar1 == (DUH_SIGNAL *)0x0) {
        if (desc->unload_sigdata != (DUH_UNLOAD_SIGDATA)0x0) {
          (*desc->unload_sigdata)(sigdata);
        }
      }
      else {
        pDVar1->desc = desc;
        pDVar1->sigdata = sigdata;
      }
      *__src = pDVar1;
      iVar2 = -(uint)(pDVar1 == (DUH_SIGNAL *)0x0);
    }
  }
  return iVar2;
}

Assistant:

int DUMBEXPORT duh_add_signal(DUH *duh, DUH_SIGTYPE_DESC *desc, sigdata_t *sigdata)
{
	DUH_SIGNAL **signal;

	if ( !duh || !desc || !sigdata ) return -1;

	signal = ( DUH_SIGNAL ** ) realloc( duh->signal, ( duh->n_signals + 1 ) * sizeof( *duh->signal ) );
	if ( !signal ) return -1;
	duh->signal = signal;

	memmove( signal + 1, signal, duh->n_signals * sizeof( *signal ) );
	duh->n_signals++;

	signal[ 0 ] = make_signal( desc, sigdata );
	if ( !signal[ 0 ] ) return -1;

	return 0;
}